

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

FuncVec * __thiscall
dg::llvmdg::DGCallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,DGCallGraphImpl *this,Function *F)

{
  _Rb_tree_header *p_Var1;
  pointer *pppFVar2;
  pointer ppFVar3;
  iterator __position;
  _Base_ptr p_Var4;
  FuncNode *pFVar5;
  _Base_ptr p_Var6;
  pointer ppFVar7;
  Function *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < F]) {
    if (*(Function **)(p_Var4 + 1) >= F) {
      p_Var6 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var4 = p_Var6, F < *(Function **)(p_Var6 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    pFVar5 = GenericCallGraph<dg::pta::PSNode_*>::get(this->_cg,(PSNode **)&p_Var4[1]._M_parent);
    ppFVar3 = (pFVar5->_calls).
              super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar7 = (pFVar5->_calls).
                   super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar3;
        ppFVar7 = ppFVar7 + 1) {
      local_28 = *(Function **)((*ppFVar7)->value + 0x18);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
        _M_realloc_insert<llvm::Function_const*>
                  ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                   __return_storage_ptr__,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        pppFVar2 = &(__return_storage_ptr__->
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar2 = *pppFVar2 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return ret;
        const auto *fnd = _cg.get(it->second);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(getFunFromNode(nd->getValue()));
        }
        return ret;
    }